

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void createFallbackEdge(_GLFWwindow *window,_GLFWfallbackEdgeWayland *edge,wl_surface *parent,
                       wl_buffer *buffer,int x,int y,int width,int height)

{
  wl_subcompositor *pwVar1;
  PFN_wl_proxy_marshal_flags p_Var2;
  uint32_t y_00;
  wl_surface *pwVar3;
  wl_proxy *wl_subsurface;
  wp_viewport *wp_viewport;
  wl_region *wl_region;
  int32_t x_00;
  int32_t height_00;
  
  pwVar3 = wl_compositor_create_surface(_glfw.wl.compositor);
  edge->surface = pwVar3;
  (*_glfw.wl.client.proxy_set_user_data)((wl_proxy *)pwVar3,window);
  (*_glfw.wl.client.proxy_set_tag)((wl_proxy *)edge->surface,&_glfw.wl.tag);
  p_Var2 = _glfw.wl.client.proxy_marshal_flags;
  pwVar1 = _glfw.wl.subcompositor;
  pwVar3 = edge->surface;
  y_00 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.subcompositor);
  height_00 = 0;
  wl_subsurface =
       (*p_Var2)((wl_proxy *)pwVar1,1,&_glfw_wl_subsurface_interface,y_00,0,0,pwVar3,parent);
  edge->subsurface = (wl_subsurface *)wl_subsurface;
  wl_subsurface_set_position((wl_subsurface *)wl_subsurface,x,y);
  wp_viewport = wp_viewporter_get_viewport(_glfw.wl.viewporter,edge->surface);
  edge->viewport = wp_viewport;
  wp_viewport_set_destination(wp_viewport,width,height);
  wl_surface_attach(edge->surface,buffer,x_00,y_00);
  wl_region = wl_compositor_create_region(_glfw.wl.compositor);
  wl_region_add(wl_region,width,height,y_00,height_00);
  wl_surface_set_opaque_region(edge->surface,wl_region);
  wl_surface_commit(edge->surface);
  wl_region_destroy(wl_region);
  return;
}

Assistant:

static void createFallbackEdge(_GLFWwindow* window,
                               _GLFWfallbackEdgeWayland* edge,
                               struct wl_surface* parent,
                               struct wl_buffer* buffer,
                               int x, int y,
                               int width, int height)
{
    edge->surface = wl_compositor_create_surface(_glfw.wl.compositor);
    wl_surface_set_user_data(edge->surface, window);
    wl_proxy_set_tag((struct wl_proxy*) edge->surface, &_glfw.wl.tag);
    edge->subsurface = wl_subcompositor_get_subsurface(_glfw.wl.subcompositor,
                                                       edge->surface, parent);
    wl_subsurface_set_position(edge->subsurface, x, y);
    edge->viewport = wp_viewporter_get_viewport(_glfw.wl.viewporter,
                                                edge->surface);
    wp_viewport_set_destination(edge->viewport, width, height);
    wl_surface_attach(edge->surface, buffer, 0, 0);

    struct wl_region* region = wl_compositor_create_region(_glfw.wl.compositor);
    wl_region_add(region, 0, 0, width, height);
    wl_surface_set_opaque_region(edge->surface, region);
    wl_surface_commit(edge->surface);
    wl_region_destroy(region);
}